

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

bool __thiscall vera::Texture::load(Texture *this,int _width,int _height,int _id)

{
  this->m_width = _width;
  this->m_height = _height;
  this->m_id = _id;
  this->m_filter = LINEAR;
  this->m_wrap = REPEAT;
  return true;
}

Assistant:

bool Texture::load(int _width, int _height, int _id ) {
    m_width     = _width;
    m_height    = _height;
    m_id        = _id; 

    m_filter    = LINEAR;
    m_wrap      = REPEAT;
    return true;
}